

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attentional.h
# Opt level: O3

vector<float,_std::allocator<float>_> * __thiscall
dynet::AttentionalModel<dynet::LSTMBuilder>::auxiliary_vector
          (AttentionalModel<dynet::LSTMBuilder> *this)

{
  pointer ppvVar1;
  ulong uVar2;
  uint uVar3;
  iterator __position;
  vector<float,_std::allocator<float>_> *local_30;
  
  __position._M_current =
       (this->aux_vecs).
       super__Vector_base<std::vector<float,_std::allocator<float>_>_*,_std::allocator<std::vector<float,_std::allocator<float>_>_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  ppvVar1 = (this->aux_vecs).
            super__Vector_base<std::vector<float,_std::allocator<float>_>_*,_std::allocator<std::vector<float,_std::allocator<float>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  uVar3 = this->num_aux_vecs;
  uVar2 = (ulong)uVar3;
  if ((ulong)((long)__position._M_current - (long)ppvVar1 >> 3) <= uVar2) {
    do {
      local_30 = (vector<float,_std::allocator<float>_> *)operator_new(0x18);
      (local_30->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      (local_30->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      (local_30->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      if (__position._M_current ==
          (this->aux_vecs).
          super__Vector_base<std::vector<float,_std::allocator<float>_>_*,_std::allocator<std::vector<float,_std::allocator<float>_>_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<std::vector<float,std::allocator<float>>*,std::allocator<std::vector<float,std::allocator<float>>*>>
        ::_M_realloc_insert<std::vector<float,std::allocator<float>>*>
                  ((vector<std::vector<float,std::allocator<float>>*,std::allocator<std::vector<float,std::allocator<float>>*>>
                    *)&this->aux_vecs,__position,&local_30);
        uVar2 = (ulong)this->num_aux_vecs;
        __position._M_current =
             (this->aux_vecs).
             super__Vector_base<std::vector<float,_std::allocator<float>_>_*,_std::allocator<std::vector<float,_std::allocator<float>_>_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
      }
      else {
        *__position._M_current = local_30;
        __position._M_current =
             (this->aux_vecs).
             super__Vector_base<std::vector<float,_std::allocator<float>_>_*,_std::allocator<std::vector<float,_std::allocator<float>_>_*>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
        (this->aux_vecs).
        super__Vector_base<std::vector<float,_std::allocator<float>_>_*,_std::allocator<std::vector<float,_std::allocator<float>_>_*>_>
        ._M_impl.super__Vector_impl_data._M_finish = __position._M_current;
      }
      uVar3 = (uint)uVar2;
      ppvVar1 = (this->aux_vecs).
                super__Vector_base<std::vector<float,_std::allocator<float>_>_*,_std::allocator<std::vector<float,_std::allocator<float>_>_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while ((ulong)((long)__position._M_current - (long)ppvVar1 >> 3) <= uVar2);
  }
  this->num_aux_vecs = uVar3 + 1;
  return ppvVar1[uVar2];
}

Assistant:

std::vector<float>* AttentionalModel<Builder>::auxiliary_vector()
{
    while (num_aux_vecs >= aux_vecs.size())
        aux_vecs.push_back(new std::vector<float>());
    // NB, we return the last auxiliary vector, AND increment counter
    return aux_vecs[num_aux_vecs++]; 
}